

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O0

UniquePtr<struct_stack_st_CRYPTO_BUFFER> __thiscall
bssl::SSL_parse_CA_list(bssl *this,SSL *ssl,uint8_t *out_alert,CBS *cbs)

{
  _func_bool_stack_st_CRYPTO_BUFFER_ptr *p_Var1;
  bool bVar2;
  enable_if_t<_internal::StackTraits<stack_st_CRYPTO_BUFFER>::kIsConst,_bool> eVar3;
  int iVar4;
  pointer psVar5;
  stack_st_CRYPTO_BUFFER *__p;
  size_t sVar6;
  CRYPTO_BUFFER *__p_00;
  pointer psVar7;
  byte local_b9;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_80;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_78;
  UniquePtr<CRYPTO_BUFFER> buffer;
  CBS distinguished_name;
  undefined1 local_50 [8];
  CBS child;
  unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> local_38;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> ret;
  CRYPTO_BUFFER_POOL *pool;
  CBS *cbs_local;
  uint8_t *out_alert_local;
  SSL *ssl_local;
  
  psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl->ctx);
  ret._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter,_true,_true>)psVar5->pool;
  __p = sk_CRYPTO_BUFFER_new_null();
  std::unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter> *)&local_38,__p);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_38);
  if (bVar2) {
    iVar4 = CBS_get_u16_length_prefixed(cbs,(CBS *)local_50);
    if (iVar4 == 0) {
      *out_alert = '2';
      ERR_put_error(0x10,0,0xa2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                    ,0x184);
      std::unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
      child.len._4_4_ = 1;
    }
    else {
      do {
        sVar6 = CBS_len((CBS *)local_50);
        if (sVar6 == 0) {
          psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl->ctx);
          p_Var1 = psVar5->x509_method->check_CA_list;
          psVar7 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get(&local_38);
          bVar2 = (*p_Var1)(psVar7);
          if (bVar2) {
            std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::unique_ptr
                      ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)this,&local_38
                      );
            child.len._4_4_ = 1;
          }
          else {
            *out_alert = '2';
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                          ,0x19b);
            std::unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter> *)this,
                       (nullptr_t)0x0);
            child.len._4_4_ = 1;
          }
          break;
        }
        iVar4 = CBS_get_u16_length_prefixed((CBS *)local_50,(CBS *)&buffer);
        if (iVar4 == 0) {
          *out_alert = '2';
          ERR_put_error(0x10,0,0x7b,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                        ,0x18c);
          std::unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter> *)this,
                     (nullptr_t)0x0);
          child.len._4_4_ = 1;
          break;
        }
        __p_00 = CRYPTO_BUFFER_new_from_CBS
                           ((CBS *)&buffer,
                            (CRYPTO_BUFFER_POOL *)
                            ret._M_t.
                            super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>.
                            _M_t.
                            super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                            .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl);
        std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&local_78,__p_00);
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_78);
        local_b9 = 1;
        if (bVar2) {
          psVar7 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get(&local_38);
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::unique_ptr
                    (&local_80,&local_78);
          eVar3 = PushToStack<stack_st_CRYPTO_BUFFER>(psVar7,&local_80);
          local_b9 = eVar3 ^ 0xff;
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_80);
        }
        bVar2 = (local_b9 & 1) != 0;
        if (bVar2) {
          *out_alert = 'P';
          std::unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter> *)this,
                     (nullptr_t)0x0);
        }
        child.len._5_3_ = 0;
        child.len._4_1_ = bVar2;
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_78);
      } while (child.len._4_4_ == 0);
    }
  }
  else {
    *out_alert = 'P';
    std::unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
    child.len._4_4_ = 1;
  }
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  return (__uniq_ptr_data<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

UniquePtr<STACK_OF(CRYPTO_BUFFER)> SSL_parse_CA_list(SSL *ssl,
                                                     uint8_t *out_alert,
                                                     CBS *cbs) {
  CRYPTO_BUFFER_POOL *const pool = ssl->ctx->pool;

  UniquePtr<STACK_OF(CRYPTO_BUFFER)> ret(sk_CRYPTO_BUFFER_new_null());
  if (!ret) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return nullptr;
  }

  CBS child;
  if (!CBS_get_u16_length_prefixed(cbs, &child)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_LENGTH_MISMATCH);
    return nullptr;
  }

  while (CBS_len(&child) > 0) {
    CBS distinguished_name;
    if (!CBS_get_u16_length_prefixed(&child, &distinguished_name)) {
      *out_alert = SSL_AD_DECODE_ERROR;
      OPENSSL_PUT_ERROR(SSL, SSL_R_CA_DN_TOO_LONG);
      return nullptr;
    }

    UniquePtr<CRYPTO_BUFFER> buffer(
        CRYPTO_BUFFER_new_from_CBS(&distinguished_name, pool));
    if (!buffer ||  //
        !PushToStack(ret.get(), std::move(buffer))) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return nullptr;
    }
  }

  if (!ssl->ctx->x509_method->check_CA_list(ret.get())) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return nullptr;
  }

  return ret;
}